

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O1

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined4 in_register_0000131c;
  
  uVar1 = a->c;
  uVar11 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar13 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        pfVar10 = (float *)(a->cstep * uVar9 * a->elemsize + (long)a->data);
        pauVar12 = (undefined1 (*) [16])(c->cstep * uVar9 * c->elemsize + (long)c->data);
        fVar17 = 1.0 / *b->data;
        auVar2 = vshufps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),0);
        fVar18 = auVar2._0_4_;
        fVar19 = auVar2._4_4_;
        fVar20 = auVar2._8_4_;
        if ((int)uVar11 < 8) {
          uVar14 = 0;
        }
        else {
          iVar13 = 7;
          do {
            fVar3 = pfVar10[1];
            fVar4 = pfVar10[2];
            fVar5 = pfVar10[3];
            fVar6 = pfVar10[4];
            fVar7 = pfVar10[5];
            fVar8 = pfVar10[6];
            *(float *)*pauVar12 = fVar18 * *pfVar10;
            *(float *)((long)*pauVar12 + 4) = fVar19 * fVar3;
            *(float *)((long)*pauVar12 + 8) = fVar20 * fVar4;
            *(float *)((long)*pauVar12 + 0xc) = auVar2._12_4_ * fVar5;
            *(float *)pauVar12[1] = fVar18 * fVar6;
            *(float *)(pauVar12[1] + 4) = fVar19 * fVar7;
            *(float *)(pauVar12[1] + 8) = fVar20 * fVar8;
            *(undefined4 *)(pauVar12[1] + 0xc) = in_register_0000131c;
            pfVar10 = pfVar10 + 8;
            pauVar12 = pauVar12 + 2;
            iVar13 = iVar13 + 8;
            uVar14 = uVar11 & 0xfffffff8;
          } while (iVar13 < (int)uVar11);
        }
        uVar16 = uVar14 | 3;
        while ((int)uVar16 < (int)uVar11) {
          auVar21._0_4_ = fVar18 * *pfVar10;
          auVar21._4_4_ = fVar19 * pfVar10[1];
          auVar21._8_4_ = fVar20 * pfVar10[2];
          auVar21._12_4_ = auVar2._12_4_ * pfVar10[3];
          *pauVar12 = auVar21;
          pfVar10 = pfVar10 + 4;
          pauVar12 = pauVar12 + 1;
          uVar16 = uVar14 + 7;
          uVar14 = uVar14 + 4;
        }
        if (uVar11 - uVar14 != 0 && (int)uVar14 <= (int)uVar11) {
          lVar15 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar15 * 4) = fVar17 * pfVar10[lVar15];
            lVar15 = lVar15 + 1;
          } while (uVar11 - uVar14 != (int)lVar15);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}